

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O0

void __thiscall QStandardItem::setRowCount(QStandardItem *this,int rows)

{
  int in_ESI;
  QStandardItem *in_RDI;
  long in_FS_OFFSET;
  int unaff_retaddr;
  int unaff_retaddr_00;
  QStandardItem *in_stack_00000010;
  int rc;
  int local_18 [3];
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_ESI;
  local_18[2] = rowCount(in_RDI);
  if (local_18[2] != local_c) {
    if (local_18[2] < local_c) {
      local_18[1] = 0;
      qMax<int>(local_18 + 2,local_18 + 1);
      insertRows(this,unaff_retaddr_00,unaff_retaddr);
    }
    else {
      local_18[0] = 0;
      qMax<int>(&local_c,local_18);
      removeRows(in_stack_00000010,this._4_4_,(int)this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QStandardItem::setRowCount(int rows)
{
    int rc = rowCount();
    if (rc == rows)
        return;
    if (rc < rows)
        insertRows(qMax(rc, 0), rows - rc);
    else
        removeRows(qMax(rows, 0), rc - rows);
}